

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QRect __thiscall QMainWindowLayoutState::itemRect(QMainWindowLayoutState *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  QList<int> *in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  int i;
  QRect *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffffa0;
  int iVar4;
  QDockAreaLayout *this_00;
  undefined1 local_18 [16];
  undefined1 auVar5 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  piVar2 = QList<int>::first((QList<int> *)in_stack_ffffffffffffff80);
  iVar4 = *piVar2;
  if (iVar4 == 0) {
    QList<int>::mid((QList<int> *)this_00,(qsizetype)in_RSI,(ulong)in_stack_ffffffffffffffa0);
    local_18 = (undefined1  [16])
               QToolBarAreaLayout::itemRect
                         ((QToolBarAreaLayout *)CONCAT44(iVar4,in_stack_ffffffffffffffa0),
                          (QList<int> *)in_RDI);
    QList<int>::~QList((QList<int> *)0x5f45c3);
  }
  else if (iVar4 == 1) {
    QList<int>::mid((QList<int> *)this_00,(qsizetype)in_RSI,CONCAT44(1,in_stack_ffffffffffffffa0));
    local_18 = (undefined1  [16])QDockAreaLayout::itemRect(this_00,in_RSI);
    QList<int>::~QList((QList<int> *)0x5f461a);
  }
  else {
    QRect::QRect(in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar3.x1.m_i = local_18._0_4_;
    auVar5._4_4_ = local_18._4_4_;
    QVar3.x2.m_i = local_18._8_4_;
    QVar3.y2.m_i = local_18._12_4_;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMainWindowLayoutState::itemRect(const QList<int> &path) const
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        return toolBarAreaLayout.itemRect(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.itemRect(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return QRect();
}